

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

void lin_reg<float,float>
               (vector<float,_std::allocator<float>_> *x,vector<float,_std::allocator<float>_> *y,
               double *coeff,double *intercept,size_t start,size_t end)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  pfVar1 = (y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pfVar2 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  if ((long)(y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
            _M_finish - (long)pfVar1 != lVar3) {
    __assert_fail("y.size() == x.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                  ,0x2c,
                  "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
                 );
  }
  if (end <= (ulong)(lVar3 >> 2)) {
    dVar6 = 0.0;
    dVar5 = 0.0;
    if (end != start) {
      lVar3 = start * 4;
      do {
        dVar5 = dVar5 + (double)(*(float *)((long)pfVar2 + lVar3) * *(float *)((long)pfVar2 + lVar3)
                                );
        lVar3 = lVar3 + 4;
      } while (end * 4 - lVar3 != 0);
    }
    if (end != start) {
      lVar3 = start * 4;
      dVar6 = 0.0;
      do {
        dVar6 = dVar6 + (double)*(float *)((long)pfVar2 + lVar3);
        lVar3 = lVar3 + 4;
      } while (end * 4 - lVar3 != 0);
    }
    dVar8 = 0.0;
    dVar7 = 0.0;
    if (end != start) {
      lVar3 = start * 4;
      do {
        dVar7 = dVar7 + (double)*(float *)((long)pfVar1 + lVar3);
        lVar3 = lVar3 + 4;
      } while (end * 4 - lVar3 != 0);
    }
    lVar3 = end - start;
    if (lVar3 != 0) {
      lVar4 = start << 2;
      dVar8 = 0.0;
      do {
        dVar8 = dVar8 + (double)(*(float *)((long)pfVar2 + lVar4) * *(float *)((long)pfVar1 + lVar4)
                                );
        lVar4 = lVar4 + 4;
      } while (end * 4 != lVar4);
    }
    auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar10._0_8_ = lVar3;
    auVar10._12_4_ = 0x45300000;
    dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    dVar9 = dVar11 * dVar5 - dVar6 * dVar6;
    *intercept = (dVar5 / dVar9) * dVar7 + (-dVar6 / dVar9) * dVar8;
    *coeff = (-dVar6 / dVar9) * dVar7 + (dVar11 / dVar9) * dVar8;
    return;
  }
  __assert_fail("start >= 0 && end <= x.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                ,0x2d,
                "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
               );
}

Assistant:

void lin_reg(vector<T1> &x, vector<T2> &y, double *coeff, double *intercept,
             size_t start, size_t end) {
  /* calculate LSLR on x,y from position start to end (excluded). */

  assert(y.size() == x.size());
  assert(start >= 0 && end <= x.size());

  double m00, m11, m01, det;
  double i00, i11, i01;

  m00 = end - start;
  m11 =
      inner_product(x.begin() + start, x.begin() + end, x.begin() + start, 0.0);
  m01 = accumulate(x.begin() + start, x.begin() + end, 0.0);

  det = (m00 * m11) - m01 * m01;

  i00 = m11 / det;
  i11 = m00 / det;
  i01 = -m01 / det;

  double v1 = accumulate(y.begin() + start, y.begin() + end, 0.0);
  double v2 =
      inner_product(x.begin() + start, x.begin() + end, y.begin() + start, 0.0);

  *intercept = i00 * v1 + i01 * v2;
  *coeff = i01 * v1 + i11 * v2;
}